

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::RedeferFunction(FunctionBody *this)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  ThreadContext *pTVar4;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar5;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *pWVar6;
  FunctionInfo *this_00;
  code *pcVar7;
  bool bVar8;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  undefined4 *puVar12;
  void *pvVar13;
  ByteBlock *pBVar14;
  long lVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseableFunctionInfo *pPVar16;
  char16_t *pcVar17;
  long lVar18;
  
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x561,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_00767554;
    *puVar12 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar8) goto LAB_00767554;
    *puVar12 = 0;
  }
  if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes &
      CanDefer) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x3bc,"(this->CanBeDeferred())","this->CanBeDeferred()");
    if (!bVar8) goto LAB_00767554;
    *puVar12 = 0;
  }
  uVar10 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_00767554;
    *puVar12 = 0;
  }
  bVar8 = Phases::IsEnabled((Phases *)&DAT_015ca868,RedeferralPhase,uVar10,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar8) {
    pTVar4 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
             threadContext;
    pTVar4->redeferredFunctions = pTVar4->redeferredFunctions + 1;
    uVar9 = GetCountField(this,InlineCacheCount);
    pTVar4->recoveredBytes = uVar9 * 0x20 + pTVar4->recoveredBytes + 0x1e8;
    pBVar14 = (this->byteCodeBlock).ptr;
    if (pBVar14 != (ByteBlock *)0x0) {
      uVar10 = ByteBlock::GetLength(pBVar14);
      pTVar4->recoveredBytes = pTVar4->recoveredBytes + uVar10;
      pvVar13 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxBlock);
      if (pvVar13 != (void *)0x0) {
        pBVar14 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxBlock);
        uVar10 = ByteBlock::GetLength(pBVar14);
        pTVar4->recoveredBytes = pTVar4->recoveredBytes + uVar10;
      }
    }
    pSVar5 = (this->entryPoints).ptr;
    if ((pSVar5 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                    *)0x0) &&
       (lVar15 = (long)(pSVar5->
                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ).
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                       .count, 0 < lVar15)) {
      pWVar6 = (pSVar5->
               super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ).
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
               .buffer.ptr;
      lVar18 = 0;
      do {
        if (((pWVar6[lVar18].ptr)->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) {
          pTVar4->recoveredBytes = pTVar4->recoveredBytes + 8;
        }
        lVar18 = lVar18 + 1;
      } while (lVar15 != lVar18);
    }
  }
  puVar1 = &(this->counters).field_0x1;
  *puVar1 = *puVar1 & 0xfe;
  uVar10 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_00767554;
    *puVar12 = 0;
  }
  bVar8 = Phases::IsEnabled((Phases *)&DAT_015cd718,RedeferralPhase,uVar10,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar8) {
    uVar2 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) {
LAB_00767554:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar12 = 0;
    }
    uVar3 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId;
    iVar11 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    if (CONCAT44(extraout_var,iVar11) == 0) {
      pcVar17 = L"Anonymous function)";
    }
    else {
      iVar11 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar17 = (char16_t *)CONCAT44(extraout_var_00,iVar11);
    }
    Output::Print(L"Redeferring function %d.%d: %s\n",(ulong)uVar2,(ulong)uVar3,pcVar17);
    Output::Flush();
  }
  pPVar16 = ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  RedeferFunctionObjectTypes(this);
  Cleanup(this,false);
  if ((this->field_0x178 & 8) != 0) {
    Utf8SourceInfo::RemoveFunctionBody
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,this);
  }
  *(undefined1 *)&this_00->attributes = (char)this_00->attributes | DeferredParse;
  Memory::Recycler::WBSetBit((char *)&this_00->functionBodyImpl);
  (this_00->functionBodyImpl).ptr = &pPVar16->super_FunctionProxy;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->functionBodyImpl);
  FunctionInfo::SetOriginalEntryPoint(this_00,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

void FunctionBody::RedeferFunction()
    {
        Assert(this->CanBeDeferred());

#if DBG
        if (PHASE_STATS(RedeferralPhase, this))
        {
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            threadContext->redeferredFunctions++;
            threadContext->recoveredBytes += sizeof(*this) + this->GetInlineCacheCount() * sizeof(InlineCache);
            if (this->byteCodeBlock)
            {
                threadContext->recoveredBytes += this->byteCodeBlock->GetLength();
                if (this->GetAuxiliaryData())
                {
                    threadContext->recoveredBytes += this->GetAuxiliaryData()->GetLength();
                }
            }
            this->MapEntryPoints([&](int index, FunctionEntryPointInfo * info) {
                threadContext->recoveredBytes += sizeof(info);
            });

            // TODO: Get size of polymorphic caches, jitted code, etc.
        }

        // We can't get here if the function is being jitted. Jitting was either completed or not begun.
        this->UnlockCounters();
#endif

        PHASE_PRINT_TRACE(Js::RedeferralPhase, this, _u("Redeferring function %d.%d: %s\n"),
                          GetSourceContextId(), GetLocalFunctionId(),
                          GetDisplayName() ? GetDisplayName() : _u("Anonymous function)"));

        ParseableFunctionInfo * parseableFunctionInfo =
            Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
        FunctionInfo * functionInfo = this->GetFunctionInfo();

        this->RedeferFunctionObjectTypes();

        this->Cleanup(false);

        if (GetIsFuncRegistered())
        {
            this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
        }

        // New allocation is done at this point, so update existing structures
        // Adjust functionInfo attributes, point to new proxy
        functionInfo->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        functionInfo->SetFunctionProxy(parseableFunctionInfo);
        functionInfo->SetOriginalEntryPoint(DefaultEntryThunk);
    }